

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O2

void InstructionSet::M68k::Primitive::multiply<true,CPU::MC68000::ProcessorBase>
               (uint16_t source,uint32_t *destination,Status *status,ProcessorBase *flow_controller)

{
  uint uVar1;
  undefined6 in_register_0000003a;
  
  uVar1 = (uint)(ushort)*destination * (int)CONCAT62(in_register_0000003a,source);
  *destination = uVar1;
  status->overflow_flag = 0;
  status->negative_flag = 0;
  status->carry_flag = 0;
  status->zero_result = (ulong)uVar1;
  CPU::MC68000::ProcessorBase::did_mulu<unsigned_short>(flow_controller,source);
  return;
}

Assistant:

void multiply(uint16_t source, uint32_t &destination, Status &status, FlowController &flow_controller) {
	if constexpr (is_mulu) {
		destination = source * uint16_t(destination);
	} else {
		destination = u_extend16(source) * u_extend16(uint16_t(destination));
	}
	status.carry_flag = status.overflow_flag = 0;
	status.set_neg_zero(destination);

	if constexpr (is_mulu) {
		flow_controller.did_mulu(source);
	} else {
		flow_controller.did_muls(source);
	}
}